

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_eq(BtorSimBitVector *a,BtorSimBitVector *b)

{
  BtorSimBitVector *bv;
  long in_RSI;
  long in_RDI;
  BtorSimBitVector *res;
  uint32_t bit;
  uint32_t i;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 local_18;
  undefined4 local_14;
  
  bv = btorsim_bv_new((uint32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  local_18 = 1;
  local_14 = 0;
  do {
    if (*(uint *)(in_RDI + 4) <= local_14) {
LAB_0013a140:
      btorsim_bv_set_bit(bv,0,local_18);
      return bv;
    }
    if (*(int *)(in_RDI + 8 + (ulong)local_14 * 4) != *(int *)(in_RSI + 8 + (ulong)local_14 * 4)) {
      local_18 = 0;
      goto LAB_0013a140;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

BtorSimBitVector *
btorsim_bv_eq (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint32_t i, bit;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  bit = 1;
  for (i = 0; i < a->len; i++)
  {
    if (a->bits[i] != b->bits[i])
    {
      bit = 0;
      break;
    }
  }
  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}